

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::MergePartialFromCodedStream
          (MessageLite *this,CodedInputStream *input)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *ptr;
  ZeroCopyCodedInputStream zcis;
  ParseContext ctx;
  char *local_b0;
  ZeroCopyCodedInputStream *local_a8;
  ZeroCopyCodedInputStream local_a0;
  ParseContext local_90;
  
  local_a8 = &local_a0;
  local_a0.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__ZeroCopyInputStream_0060dde8;
  local_a0.cis_ = input;
  internal::ParseContext::ParseContext<google::protobuf::ZeroCopyCodedInputStream*>
            (&local_90,input->recursion_budget_,input->aliasing_enabled_,&local_b0,&local_a8);
  local_90.group_depth_ = 0;
  local_90.data_.pool._0_4_ = *(undefined4 *)&input->extension_pool_;
  local_90.data_.pool._4_4_ = *(undefined4 *)((long)&input->extension_pool_ + 4);
  local_90.data_.factory._0_4_ = *(undefined4 *)&input->extension_factory_;
  local_90.data_.factory._4_4_ = *(undefined4 *)((long)&input->extension_factory_ + 4);
  iVar2 = (*this->_vptr_MessageLite[0xd])(this,local_b0,&local_90);
  local_b0 = (char *)CONCAT44(extraout_var,iVar2);
  if (local_b0 == (char *)0x0) {
LAB_00285f6c:
    bVar1 = false;
  }
  else {
    internal::EpsCopyInputStream::BackUp(&local_90.super_EpsCopyInputStream,local_b0);
    if (local_90.super_EpsCopyInputStream.last_tag_minus_1_ == 1) {
      input->legitimate_message_end_ = true;
    }
    else {
      if ((local_90.super_EpsCopyInputStream.limit_end_ < local_b0) &&
         ((local_90.super_EpsCopyInputStream.next_chunk_ == (char *)0x0 ||
          ((long)local_90.super_EpsCopyInputStream.limit_ <
           (long)local_b0 - (long)local_90.super_EpsCopyInputStream.buffer_end_))))
      goto LAB_00285f6c;
      input->last_tag_ = local_90.super_EpsCopyInputStream.last_tag_minus_1_ + 1;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool MessageLite::MergePartialFromCodedStream(io::CodedInputStream* input) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = _InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    GOOGLE_DCHECK(ctx.LastTag() != 1);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
    return true;
  }
  input->SetConsumed();
  return true;
}